

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT8 __thiscall DROPlayer::UnloadFile(DROPlayer *this)

{
  pointer puVar1;
  pointer p_Var2;
  pointer pDVar3;
  UINT8 UVar4;
  
  UVar4 = 0xff;
  if ((this->_playState & 1) == 0) {
    this->_playState = '\0';
    this->_dLoad = (DATA_LOADER *)0x0;
    this->_fileData = (UINT8 *)0x0;
    (this->_fileHdr).verMajor = 0xff;
    (this->_fileHdr).dataOfs = 0;
    puVar1 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    puVar1 = (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    p_Var2 = (this->_devCfgs).
             super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devCfgs).
        super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
        super__Vector_impl_data._M_finish != p_Var2) {
      (this->_devCfgs).
      super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
      super__Vector_impl_data._M_finish = p_Var2;
    }
    pDVar3 = (this->_devices).
             super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devices).
        super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
        super__Vector_impl_data._M_finish != pDVar3) {
      (this->_devices).
      super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
      super__Vector_impl_data._M_finish = pDVar3;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->_devNames);
    UVar4 = '\0';
  }
  return UVar4;
}

Assistant:

UINT8 DROPlayer::UnloadFile(void)
{
	if (_playState & PLAYSTATE_PLAY)
		return 0xFF;
	
	_playState = 0x00;
	_dLoad = NULL;
	_fileData = NULL;
	_fileHdr.verMajor = 0xFF;
	_fileHdr.dataOfs = 0x00;
	_devTypes.clear();
	_devPanning.clear();
	_devCfgs.clear();
	_devices.clear();
	_devNames.clear();
	
	return 0x00;
}